

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void interpolatetest(void)

{
  double local_98 [13];
  double local_30;
  double ylo;
  double yhi;
  
  local_98[0] = -4.38;
  local_98[1] = -4.15;
  local_98[2] = -4.04;
  local_98[3] = -3.99;
  local_98[4] = -3.98;
  local_98[5] = -3.96;
  local_98[6] = 25.0;
  local_98[7] = 50.0;
  local_98[8] = 100.0;
  local_98[9] = 250.0;
  local_98[10] = 500.0;
  local_98[0xb] = 100000.0;
  arrayminmax(local_98,6,&local_30,&ylo);
  interpolate_linear(local_98 + 6,local_98,6,2000.0);
  printf("OUT %g \n");
  return;
}

Assistant:

void interpolatetest() {
	int N;
	double ylo,yhi,val,out;

	double tablei[6] = { -4.38, -4.15, -4.04, -3.99, -3.98, -3.96};
	double tablet[6] = {25, 50, 100, 250, 500, 100000};

	val = 2000;
	N = 6;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);


}